

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::ConstructMessage<duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,Exception *this,string *msg,LogicalType *params,
          LogicalType *params_1)

{
  LogicalType *in_R9;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_68;
  LogicalType local_48;
  LogicalType local_30;
  
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  LogicalType::LogicalType(&local_30,(LogicalType *)msg);
  LogicalType::LogicalType(&local_48,params);
  ConstructMessageRecursive<duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,this,&local_68,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &local_30,&local_48,in_R9);
  LogicalType::~LogicalType(&local_48);
  LogicalType::~LogicalType(&local_30);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_68);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}